

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenTry(BinaryenModuleRef module,char *name,BinaryenExpressionRef body,char **catchTags,
           BinaryenIndex numCatchTags,BinaryenExpressionRef *catchBodies,
           BinaryenIndex numCatchBodies,char *delegateTarget)

{
  Try *this;
  ArenaVector<wasm::Name> *this_00;
  optional<wasm::Type> type_;
  optional<wasm::Type> local_90;
  Name local_80;
  uint local_6c;
  undefined1 auStack_68 [4];
  BinaryenIndex i_1;
  uint local_54;
  undefined1 local_50 [4];
  BinaryenIndex i;
  Try *local_40;
  Try *ret;
  BinaryenExpressionRef *catchBodies_local;
  char **ppcStack_28;
  BinaryenIndex numCatchTags_local;
  char **catchTags_local;
  BinaryenExpressionRef body_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  ret = (Try *)catchBodies;
  catchBodies_local._4_4_ = numCatchTags;
  ppcStack_28 = catchTags;
  catchTags_local = (char **)body;
  body_local = (BinaryenExpressionRef)name;
  name_local = (char *)module;
  local_40 = MixedArena::alloc<wasm::Try>(&module->allocator);
  if (body_local != (BinaryenExpressionRef)0x0) {
    wasm::Name::Name((Name *)local_50,(char *)body_local);
    wasm::Name::operator=(&local_40->name,(Name *)local_50);
  }
  local_40->body = (Expression *)catchTags_local;
  for (local_54 = 0; local_54 < catchBodies_local._4_4_; local_54 = local_54 + 1) {
    this_00 = &local_40->catchTags;
    wasm::Name::Name((Name *)auStack_68,ppcStack_28[local_54]);
    ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::push_back
              (&this_00->super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
               (Name)_auStack_68);
  }
  for (local_6c = 0; local_6c < numCatchBodies; local_6c = local_6c + 1) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(local_40->catchBodies).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               *(Expression **)
                (&(ret->super_SpecificExpression<(wasm::Expression::Id)52>).super_Expression._id +
                (ulong)local_6c * 8));
  }
  if (delegateTarget != (char *)0x0) {
    wasm::Name::Name(&local_80,delegateTarget);
    wasm::Name::operator=(&local_40->delegateTarget,&local_80);
  }
  this = local_40;
  std::optional<wasm::Type>::optional(&local_90);
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_90.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  wasm::Try::finalize(this,type_);
  return (BinaryenExpressionRef)local_40;
}

Assistant:

BinaryenExpressionRef BinaryenTry(BinaryenModuleRef module,
                                  const char* name,
                                  BinaryenExpressionRef body,
                                  const char** catchTags,
                                  BinaryenIndex numCatchTags,
                                  BinaryenExpressionRef* catchBodies,
                                  BinaryenIndex numCatchBodies,
                                  const char* delegateTarget) {
  auto* ret = ((Module*)module)->allocator.alloc<Try>();
  if (name) {
    ret->name = name;
  }
  ret->body = (Expression*)body;
  for (BinaryenIndex i = 0; i < numCatchTags; i++) {
    ret->catchTags.push_back(catchTags[i]);
  }
  for (BinaryenIndex i = 0; i < numCatchBodies; i++) {
    ret->catchBodies.push_back((Expression*)catchBodies[i]);
  }
  if (delegateTarget) {
    ret->delegateTarget = delegateTarget;
  }
  ret->finalize();
  return static_cast<Expression*>(ret);
}